

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::IssueMessage(cmMakefile *this,MessageType t,string *text)

{
  undefined8 text_00;
  MessageType t_00;
  bool bVar1;
  const_reference ppcVar2;
  cmake *this_00;
  undefined1 local_30 [24];
  string *text_local;
  cmMakefile *pcStack_10;
  MessageType t_local;
  cmMakefile *this_local;
  
  local_30._16_8_ = text;
  text_local._4_4_ = t;
  pcStack_10 = this;
  bVar1 = std::vector<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>::empty
                    (&this->ExecutionStatusStack);
  if ((!bVar1) && ((text_local._4_4_ == FATAL_ERROR || (text_local._4_4_ == INTERNAL_ERROR)))) {
    ppcVar2 = std::vector<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>::back
                        (&this->ExecutionStatusStack);
    cmExecutionStatus::SetNestedError(*ppcVar2);
  }
  this_00 = GetCMakeInstance(this);
  t_00 = text_local._4_4_;
  text_00 = local_30._16_8_;
  GetBacktrace((cmMakefile *)local_30);
  cmake::IssueMessage(this_00,t_00,(string *)text_00,(cmListFileBacktrace *)local_30);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_30);
  return;
}

Assistant:

void cmMakefile::IssueMessage(MessageType t, std::string const& text) const
{
  if (!this->ExecutionStatusStack.empty()) {
    if ((t == MessageType::FATAL_ERROR) ||
        (t == MessageType::INTERNAL_ERROR)) {
      this->ExecutionStatusStack.back()->SetNestedError();
    }
  }
  this->GetCMakeInstance()->IssueMessage(t, text, this->GetBacktrace());
}